

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int flatcc_emitter(void *emit_context,flatcc_iovec_t *iov,int iov_count,flatbuffers_soffset_t offset
                  ,size_t len)

{
  int iVar1;
  void *local_40;
  uint8_t *p;
  flatcc_emitter_t *E;
  size_t len_local;
  flatbuffers_soffset_t offset_local;
  int iov_count_local;
  flatcc_iovec_t *iov_local;
  void *emit_context_local;
  
  *(size_t *)((long)emit_context + 0x30) = len + *(long *)((long)emit_context + 0x30);
  len_local._4_4_ = iov_count;
  _offset_local = iov;
  if (offset < 0) {
    if (*(ulong *)((long)emit_context + 0x18) < len) {
      len_local._4_4_ = iov_count;
      _offset_local = iov + iov_count;
      do {
        if (len_local._4_4_ == 0) {
          return 0;
        }
        iVar1 = copy_front((flatcc_emitter_t *)emit_context,(uint8_t *)_offset_local[-1].iov_base,
                           _offset_local[-1].iov_len);
        len_local._4_4_ = len_local._4_4_ + -1;
        _offset_local = _offset_local + -1;
      } while (iVar1 == 0);
      return -1;
    }
    *(size_t *)((long)emit_context + 0x10) = *(long *)((long)emit_context + 0x10) - len;
    *(size_t *)((long)emit_context + 0x18) = *(long *)((long)emit_context + 0x18) - len;
    local_40 = *(void **)((long)emit_context + 0x10);
  }
  else {
    if (*(ulong *)((long)emit_context + 0x28) < len) {
      while( true ) {
        if (len_local._4_4_ == 0) {
          return 0;
        }
        iVar1 = copy_back((flatcc_emitter_t *)emit_context,(uint8_t *)_offset_local->iov_base,
                          _offset_local->iov_len);
        if (iVar1 != 0) break;
        _offset_local = _offset_local + 1;
        len_local._4_4_ = len_local._4_4_ + -1;
      }
      return -1;
    }
    local_40 = *(void **)((long)emit_context + 0x20);
    *(size_t *)((long)emit_context + 0x20) = len + *(long *)((long)emit_context + 0x20);
    *(size_t *)((long)emit_context + 0x28) = *(long *)((long)emit_context + 0x28) - len;
  }
  while (len_local._4_4_ != 0) {
    memcpy(local_40,_offset_local->iov_base,_offset_local->iov_len);
    local_40 = (void *)(_offset_local->iov_len + (long)local_40);
    _offset_local = _offset_local + 1;
    len_local._4_4_ = len_local._4_4_ + -1;
  }
  return 0;
}

Assistant:

int flatcc_emitter(void *emit_context,
        const flatcc_iovec_t *iov, int iov_count,
        flatbuffers_soffset_t offset, size_t len)
{
    flatcc_emitter_t *E = emit_context;
    uint8_t *p;

    E->used += len;
    if (offset < 0) {
        if (len <= E->front_left) {
            E->front_cursor -= len;
            E->front_left -= len;
            p = E->front_cursor;
            goto copy;
        }
        iov += iov_count;
        while (iov_count--) {
            --iov;
            if (copy_front(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
        }
    } else {
        if (len <= E->back_left) {
            p = E->back_cursor;
            E->back_cursor += len;
            E->back_left -= len;
            goto copy;
        }
        while (iov_count--) {
            if (copy_back(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
            ++iov;
        }
    }
    return 0;
copy:
    while (iov_count--) {
        memcpy(p, iov->iov_base, iov->iov_len);
        p += iov->iov_len;
        ++iov;
    }
    return 0;
}